

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameCataloger.cpp
# Opt level: O2

void __thiscall psy::C::NameCataloger::NameCataloger(NameCataloger *this,SyntaxTree *tree)

{
  NameCatalog *this_00;
  
  SyntaxVisitor::SyntaxVisitor(&this->super_SyntaxVisitor,tree);
  (this->super_SyntaxVisitor)._vptr_SyntaxVisitor = (_func_int **)&PTR__NameCataloger_004d6b50;
  this_00 = (NameCatalog *)operator_new(0x88);
  NameCatalog::NameCatalog(this_00);
  (this->catalog_)._M_t.
  super___uniq_ptr_impl<psy::C::NameCatalog,_std::default_delete<psy::C::NameCatalog>_>._M_t.
  super__Tuple_impl<0UL,_psy::C::NameCatalog_*,_std::default_delete<psy::C::NameCatalog>_>.
  super__Head_base<0UL,_psy::C::NameCatalog_*,_false>._M_head_impl = this_00;
  this->withinTypedef_ = false;
  return;
}

Assistant:

NameCataloger::NameCataloger(SyntaxTree* tree)
    : SyntaxVisitor(tree)
    , catalog_(new NameCatalog)
    , withinTypedef_(false)
{}